

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeFeature::IfcEdgeFeature(IfcEdgeFeature *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcEdgeFeature";
  IfcFeatureElementSubtraction::IfcFeatureElementSubtraction
            (&this->super_IfcFeatureElementSubtraction,&PTR_construction_vtable_24__00820d40);
  *(undefined8 *)&(this->super_IfcFeatureElementSubtraction).field_0x160 = 0;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x820be8;
  *(undefined8 *)&this->field_0x178 = 0x820d28;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x820c10;
  (this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x820c38;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x820c60;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0x820c88;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.field_0x138
       = 0x820cb0;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.field_0x148
       = 0x820cd8;
  *(undefined8 *)&(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.field_0x158 =
       0x820d00;
  this->field_0x170 = 0;
  return;
}

Assistant:

IfcEdgeFeature() : Object("IfcEdgeFeature") {}